

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

bool __thiscall AmpIO::ReadSiCurrentLoopParams(AmpIO *this,uint index,SiCurrentLoopParams *params)

{
  BasePort *pBVar1;
  bool bVar2;
  uint32_t local_2c;
  SiCurrentLoopParams *pSStack_28;
  uint32_t read_data;
  SiCurrentLoopParams *params_local;
  AmpIO *pAStack_18;
  uint index_local;
  AmpIO *this_local;
  
  bVar2 = (this->super_FpgaIO).super_BoardIO.port != (BasePort *)0x0;
  if (bVar2) {
    local_2c = 0;
    pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
    pSStack_28 = params;
    params_local._4_4_ = index;
    pAStack_18 = this;
    (*pBVar1->_vptr_BasePort[0x23])
              (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,
               (ulong)((index + 1) * 0x10 | 0x9001),&local_2c);
    pSStack_28->kp = local_2c;
    pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
    (*pBVar1->_vptr_BasePort[0x23])
              (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,
               (ulong)((params_local._4_4_ + 1) * 0x10 | 0x9002),&local_2c);
    pSStack_28->ki = local_2c;
    pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
    (*pBVar1->_vptr_BasePort[0x23])
              (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,
               (ulong)((params_local._4_4_ + 1) * 0x10 | 0x9005),&local_2c);
    pSStack_28->kd = local_2c;
    pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
    (*pBVar1->_vptr_BasePort[0x23])
              (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,
               (ulong)((params_local._4_4_ + 1) * 0x10 | 0x9006),&local_2c);
    pSStack_28->ff_resistive = local_2c;
    pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
    (*pBVar1->_vptr_BasePort[0x23])
              (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,
               (ulong)((params_local._4_4_ + 1) * 0x10 | 0x9003),&local_2c);
    pSStack_28->iTermLimit = (uint16_t)local_2c;
    pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
    (*pBVar1->_vptr_BasePort[0x23])
              (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,
               (ulong)((params_local._4_4_ + 1) * 0x10 | 0x9004),&local_2c);
    pSStack_28->dutyCycleLimit = (uint16_t)local_2c;
  }
  return bVar2;
}

Assistant:

bool AmpIO::ReadSiCurrentLoopParams(unsigned int index, SiCurrentLoopParams& params) const
{
    if (!port) return false;
    uint32_t read_data = 0;
    port->ReadQuadlet(BoardId, ADDR_MOTOR_CONTROL << 12 | (index + 1) << 4 | OFF_CURRENT_KP, read_data);
    params.kp = read_data;
    port->ReadQuadlet(BoardId, ADDR_MOTOR_CONTROL << 12 | (index + 1) << 4 | OFF_CURRENT_KI, read_data);
    params.ki = read_data;
    port->ReadQuadlet(BoardId, ADDR_MOTOR_CONTROL << 12 | (index + 1) << 4 | OFF_CURRENT_KD, read_data);
    params.kd = read_data;
    port->ReadQuadlet(BoardId, ADDR_MOTOR_CONTROL << 12 | (index + 1) << 4 | OFF_CURRENT_FF_RESISTIVE, read_data);
    params.ff_resistive = read_data;
    port->ReadQuadlet(BoardId, ADDR_MOTOR_CONTROL << 12 | (index + 1) << 4 | OFF_CURRENT_I_TERM_LIMIT, read_data);
    params.iTermLimit = read_data;
    port->ReadQuadlet(BoardId, ADDR_MOTOR_CONTROL << 12 | (index + 1) << 4 | OFF_DUTY_CYCLE_LIMIT, read_data);
    params.dutyCycleLimit = read_data;
    return true;
}